

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O2

int __thiscall ON_wString::ReverseFind(ON_wString *this,wchar_t *s)

{
  int iVar1;
  wchar_t wVar2;
  wchar_t *pwVar3;
  bool bVar4;
  int element_count1;
  ON_Internal_Empty_wString *pOVar5;
  ulong uVar6;
  wchar_t *p0;
  
  element_count1 = Length(s);
  pwVar3 = this->m_s;
  pOVar5 = &empty_wstring;
  if (pwVar3 != (wchar_t *)0x0) {
    pOVar5 = (ON_Internal_Empty_wString *)(pwVar3 + -3);
  }
  if ((0 < element_count1) && (iVar1 = (pOVar5->header).string_length, element_count1 <= iVar1)) {
    wVar2 = *s;
    for (uVar6 = (long)iVar1 * 4 + (long)element_count1 * -4;
        pwVar3 < (wchar_t *)((long)pwVar3 + uVar6 + 4); uVar6 = uVar6 - 4) {
      if ((wVar2 == *(wchar_t *)((long)pwVar3 + uVar6)) &&
         (bVar4 = EqualOrdinal((wchar_t *)((long)pwVar3 + uVar6),element_count1,s,element_count1,
                               false), bVar4)) {
        return (int)(uVar6 >> 2);
      }
    }
  }
  return -1;
}

Assistant:

int ON_wString::ReverseFind(const wchar_t* s) const
{
  const int s_len = ON_wString::Length(s);
  const int this_len = Length();
  if (s_len > 0 && s_len <= this_len )
  {
    const wchar_t* p0 = m_s;
    const wchar_t* p = p0 + (this_len - s_len + 1);
    const wchar_t w0 = s[0];
    while (p > p0)
    {
      p--;
      if ( w0 == p[0] && ON_wString::EqualOrdinal(p,s_len,s,s_len,false) )
        return ((int)(p - p0));
    }
  }
  return -1;
}